

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vertex.cpp
# Opt level: O0

double __thiscall Vertex::getReactivePower(Vertex *this)

{
  reference pvVar1;
  size_type sVar2;
  reference this_00;
  double dVar3;
  uint local_1c;
  double dStack_18;
  uint i;
  double reactPower;
  Vertex *this_local;
  
  pvVar1 = std::vector<LoadLevel,_std::allocator<LoadLevel>_>::operator[]
                     (&this->loadFactors,(long)idLF);
  dStack_18 = pvVar1->level * this->reactivePower;
  local_1c = 0;
  while( true ) {
    sVar2 = std::vector<Capacitor,_std::allocator<Capacitor>_>::size(&this->capacitorsAlloc);
    if (sVar2 <= local_1c) break;
    this_00 = std::vector<Capacitor,_std::allocator<Capacitor>_>::operator[]
                        (&this->capacitorsAlloc,(ulong)local_1c);
    dVar3 = Capacitor::getPower(this_00,0);
    dStack_18 = dStack_18 - dVar3;
    local_1c = local_1c + 1;
  }
  return dStack_18;
}

Assistant:

double Vertex::getReactivePower(){
    double reactPower = this->loadFactors[ idLF ].level * this->reactivePower;
    for( unsigned int i = 0; i < capacitorsAlloc.size(); i++ ) {
        reactPower -= capacitorsAlloc[i].getPower();
    }
    return reactPower;
}